

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5StorageLoadTotals(Fts5Storage *p,int bCache)

{
  int local_18;
  int rc;
  int bCache_local;
  Fts5Storage *p_local;
  
  local_18 = 0;
  if (p->bTotalsValid == 0) {
    local_18 = sqlite3Fts5IndexGetAverages(p->pIndex,&p->nTotalRow,p->aTotalSize);
    p->bTotalsValid = bCache;
  }
  return local_18;
}

Assistant:

static int fts5StorageLoadTotals(Fts5Storage *p, int bCache){
  int rc = SQLITE_OK;
  if( p->bTotalsValid==0 ){
    rc = sqlite3Fts5IndexGetAverages(p->pIndex, &p->nTotalRow, p->aTotalSize);
    p->bTotalsValid = bCache;
  }
  return rc;
}